

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  int i;
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    iVar1 = -1;
  }
  else {
    uVar4 = 1;
    do {
      if ((uint)argc == uVar4) {
        for (uVar4 = 1; (uint)argc != uVar4; uVar4 = uVar4 + 1) {
          printInfo(argv[uVar4]);
        }
        goto LAB_001048cc;
      }
      pcVar2 = argv[uVar4];
      if (((*pcVar2 == '-') && (pcVar2[1] == 'h')) && (pcVar2[2] == '\0')) {
LAB_001048b6:
        usageMessage((ostream *)&std::cout,"exrheader",true);
        goto LAB_001048cc;
      }
      iVar1 = strcmp(argv[1],"--help");
      if (iVar1 == 0) goto LAB_001048b6;
      iVar1 = strcmp(pcVar2,"--version");
      uVar4 = uVar4 + 1;
    } while (iVar1 != 0);
    pcVar2 = (char *)Imf_3_4::getLibraryVersion();
    poVar3 = std::operator<<((ostream *)&std::cout,"exrheader (OpenEXR) ");
    std::operator<<(poVar3,"3.4.0");
    iVar1 = strcmp(pcVar2,"3.4.0");
    if (iVar1 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
      poVar3 = std::operator<<(poVar3,pcVar2);
      std::operator<<(poVar3,")");
    }
    poVar3 = std::operator<<((ostream *)&std::cout," https://openexr.com");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Copyright (c) Contributors to the OpenEXR Project");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
    std::endl<char,std::char_traits<char>>(poVar3);
LAB_001048cc:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[1], "--help"))
        {
            usageMessage (cout, "exrheader", true);
            return 0;
        }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exrheader (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;
            return 0;
        }
    }

    try
    {
        for (int i = 1; i < argc; ++i)
            printInfo (argv[i]);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}